

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

Vec_Ptr_t * Bmc_MnaTernary(Gia_Man_t *p,int nFrames,int nFramesAdd,int fVerbose,int *iFirst)

{
  uint Value1;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  Vec_Ptr_t *p_00;
  uint *pInfo;
  char *pcVar8;
  abctime aVar9;
  bool bVar10;
  abctime clk;
  int Count [4];
  int i;
  int f;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  int nStateWords;
  uint *pState;
  Vec_Ptr_t *vStates;
  int *iFirst_local;
  int fVerbose_local;
  int nFramesAdd_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ManCoNum(p);
  iVar2 = Abc_BitWordNum(iVar2 << 1);
  aVar6 = Abc_Clock();
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 1;
  Count[2] = 0;
  while( true ) {
    iVar4 = Count[2];
    iVar3 = Gia_ManPiNum(p);
    bVar10 = false;
    if (iVar4 < iVar3) {
      pObjRo = Gia_ManCi(p,Count[2]);
      bVar10 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    pObjRo->Value = 3;
    Count[2] = Count[2] + 1;
  }
  Count[2] = 0;
  while( true ) {
    iVar4 = Count[2];
    iVar3 = Gia_ManRegNum(p);
    bVar10 = false;
    if (iVar4 < iVar3) {
      iVar4 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar4 + Count[2]);
      bVar10 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    pObjRo->Value = 1;
    Count[2] = Count[2] + 1;
  }
  *iFirst = -1;
  p_00 = Vec_PtrAlloc(100);
  for (Count[3] = 0;
      ((nFrames == 0 || (Count[3] != nFrames)) &&
      ((nFrames != 0 || ((*iFirst < 0 || (Count[3] != *iFirst + nFramesAdd))))));
      Count[3] = Count[3] + 1) {
    Count[2] = 0;
    while( true ) {
      iVar4 = Count[2];
      iVar3 = Gia_ManRegNum(p);
      bVar10 = false;
      if (iVar4 < iVar3) {
        iVar4 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar4 + Count[2]);
        bVar10 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar4 = Gia_ManPiNum(p);
          _i = Gia_ManCi(p,iVar4 + Count[2]);
          bVar10 = _i != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar10) break;
      _i->Value = pObjRo->Value;
      Count[2] = Count[2] + 1;
    }
    Count[2] = 0;
    while( true ) {
      bVar10 = false;
      if (Count[2] < p->nObjs) {
        pObjRo = Gia_ManObj(p,Count[2]);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar4 = Gia_ObjIsAnd(pObjRo);
      if (iVar4 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRo);
        uVar5 = pGVar7->Value;
        iVar4 = Gia_ObjFaninC0(pObjRo);
        pGVar7 = Gia_ObjFanin1(pObjRo);
        Value1 = pGVar7->Value;
        iVar3 = Gia_ObjFaninC1(pObjRo);
        uVar5 = Gia_XsimAndCond(uVar5,iVar4,Value1,iVar3);
        pObjRo->Value = uVar5;
      }
      Count[2] = Count[2] + 1;
    }
    pInfo = (uint *)malloc((long)iVar2 << 2);
    Count[2] = 0;
    while( true ) {
      iVar4 = Count[2];
      iVar3 = Vec_IntSize(p->vCos);
      bVar10 = false;
      if (iVar4 < iVar3) {
        pObjRo = Gia_ManCo(p,Count[2]);
        bVar10 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      pGVar7 = Gia_ObjFanin0(pObjRo);
      uVar5 = pGVar7->Value;
      iVar4 = Gia_ObjFaninC0(pObjRo);
      uVar5 = Gia_XsimNotCond(uVar5,iVar4);
      pObjRo->Value = uVar5;
      Gia_ManTerSimInfoSet(pInfo,Count[2],pObjRo->Value);
      iVar4 = Count[2];
      if (((*iFirst == -1) && (iVar3 = Gia_ManPoNum(p), iVar4 < iVar3)) && (pObjRo->Value == 3)) {
        *iFirst = Count[3];
      }
      Count[2] = Count[2] + 1;
    }
    Vec_PtrPush(p_00,pInfo);
    if (fVerbose != 0) {
      Count[1] = 0;
      Count[0] = 0;
      Count[2] = 0;
      while( true ) {
        iVar4 = Count[2];
        iVar3 = Gia_ManRegNum(p);
        bVar10 = false;
        if (iVar4 < iVar3) {
          iVar4 = Gia_ManPoNum(p);
          pObjRo = Gia_ManCo(p,iVar4 + Count[2]);
          bVar10 = pObjRo != (Gia_Obj_t *)0x0;
        }
        iVar1 = Count[3];
        iVar3 = Count[1];
        iVar4 = Count[0];
        if (!bVar10) break;
        Count[(ulong)pObjRo->Value - 2] = Count[(ulong)pObjRo->Value - 2] + 1;
        Count[2] = Count[2] + 1;
      }
      uVar5 = Gia_ManRegNum(p);
      pGVar7 = Gia_ManPo(p,0);
      pcVar8 = "0";
      if (pGVar7->Value == 3) {
        pcVar8 = "x";
      }
      printf("%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n",(ulong)(uint)iVar1,0,
             (ulong)(uint)iVar4,(ulong)(uint)iVar3,(ulong)uVar5,pcVar8);
    }
  }
  if (fVerbose != 0) {
    printf("Finished %d frames. First x-valued PO is in frame %d.  ",(ulong)(uint)nFrames,
           (ulong)(uint)*iFirst);
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar9 - aVar6);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Bmc_MnaTernary( Gia_Man_t * p, int nFrames, int nFramesAdd, int fVerbose, int * iFirst )
{
    Vec_Ptr_t * vStates;
    unsigned * pState;
    int nStateWords = Abc_BitWordNum( 2*Gia_ManCoNum(p) );
    Gia_Obj_t * pObj, * pObjRo;
    int f, i, Count[4];
    abctime clk = Abc_Clock();
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = GIA_UND;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = GIA_ZER;
    *iFirst = -1;
    vStates = Vec_PtrAlloc( 100 );
    for ( f = 0; ; f++ )
    {
        // if frames are given, break at frames
        if ( nFrames && f == nFrames )
            break;
        // if frames are not given, break after nFramesAdd from the first x-valued
        if ( !nFrames && *iFirst >= 0 && f == *iFirst + nFramesAdd )
            break;
        // aassign CI values
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value = pObj->Value;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
        // compute and save CO values
        pState = ABC_ALLOC( unsigned, nStateWords );
        Gia_ManForEachCo( p, pObj, i )
        {
            pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            Gia_ManTerSimInfoSet( pState, i, pObj->Value );
            if ( *iFirst == -1 && i < Gia_ManPoNum(p) && pObj->Value == GIA_UND )
                *iFirst = f;
        }
        Vec_PtrPush( vStates, pState );
        // print statistics
        if ( !fVerbose )
            continue;
        Count[0] = Count[1] = Count[2] = Count[3] = 0;
        Gia_ManForEachRi( p, pObj, i )
            Count[pObj->Value]++;
        printf( "%5d : 0 =%7d    1 =%7d    x =%7d    all =%7d   out = %s\n", 
            f, Count[GIA_ZER], Count[GIA_ONE], Count[GIA_UND], Gia_ManRegNum(p), 
            Gia_ManPo(p, 0)->Value == GIA_UND ? "x" : "0" );  
    }
//    assert( Vec_PtrSize(vStates) == nFrames );
    if ( fVerbose )
        printf( "Finished %d frames. First x-valued PO is in frame %d.  ", nFrames, *iFirst );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vStates;
}